

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

bool deqp::gls::isTessellationSupported(RenderContext *renderCtx,ContextInfo *ctxInfo)

{
  Profile PVar1;
  bool local_35;
  ApiType local_34;
  int local_30;
  ApiType local_2c;
  int minorVer;
  ApiType local_24;
  int majorVer;
  ContextInfo *ctxInfo_local;
  RenderContext *renderCtx_local;
  
  _majorVer = ctxInfo;
  ctxInfo_local = (ContextInfo *)renderCtx;
  local_24.m_bits = (*renderCtx->_vptr_RenderContext[2])();
  PVar1 = glu::ApiType::getProfile(&local_24);
  if (PVar1 == PROFILE_ES) {
    local_2c.m_bits = (*ctxInfo_local->_vptr_ContextInfo[2])();
    minorVer = glu::ApiType::getMajorVersion(&local_2c);
    local_34.m_bits = (*ctxInfo_local->_vptr_ContextInfo[2])();
    local_30 = glu::ApiType::getMinorVersion(&local_34);
    local_35 = true;
    if ((minorVer < 4) && ((minorVer != 3 || (local_35 = true, local_30 < 2)))) {
      local_35 = glu::ContextInfo::isExtensionSupported(_majorVer,"GL_EXT_tessellation_shader");
    }
    renderCtx_local._7_1_ = local_35;
  }
  else {
    renderCtx_local._7_1_ = false;
  }
  return renderCtx_local._7_1_;
}

Assistant:

static bool isTessellationSupported (const glu::RenderContext& renderCtx, const glu::ContextInfo& ctxInfo)
{
	if (renderCtx.getType().getProfile() == PROFILE_ES)
	{
		const int	majorVer	= renderCtx.getType().getMajorVersion();
		const int	minorVer	= renderCtx.getType().getMinorVersion();

		return (majorVer > 3) || (majorVer == 3 && minorVer >= 2) ||
			   ctxInfo.isExtensionSupported("GL_EXT_tessellation_shader");
	}
	else
		return false;
}